

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

char * BinaryenModuleAllocateAndWriteText(BinaryenModuleRef module)

{
  bool enabled;
  long lVar1;
  char *__result;
  char *__first;
  char *output;
  size_t len;
  __string_type str;
  ostringstream local_188 [7];
  bool colors;
  ostringstream os;
  BinaryenModuleRef module_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  enabled = Colors::isEnabled();
  Colors::setEnabled(false);
  std::operator<<((ostream *)local_188,module);
  Colors::setEnabled(enabled);
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::length();
  __result = (char *)malloc(lVar1 + 1U);
  __first = (char *)std::__cxx11::string::c_str();
  std::copy_n<char_const*,unsigned_long,char*>(__first,lVar1 + 1U,__result);
  std::__cxx11::string::~string((string *)&len);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __result;
}

Assistant:

char* BinaryenModuleAllocateAndWriteText(BinaryenModuleRef module) {
  std::ostringstream os;
  bool colors = Colors::isEnabled();

  Colors::setEnabled(false); // do not use colors for writing
  os << *(Module*)module;
  Colors::setEnabled(colors); // restore colors state

  auto str = os.str();
  const size_t len = str.length() + 1;
  char* output = (char*)malloc(len);
  std::copy_n(str.c_str(), len, output);
  return output;
}